

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clickrem.c
# Opt level: O2

void dumb_remove_clicks_array
               (int n,DUMB_CLICK_REMOVER **cr,sample_t_conflict **samples,int32 length,
               double halflife)

{
  ulong uVar1;
  ulong uVar2;
  
  if (cr != (DUMB_CLICK_REMOVER **)0x0) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)(n >> 1);
    if (n >> 1 < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 * 8 - uVar2 != 0; uVar2 = uVar2 + 8) {
      dumb_remove_clicks(*(DUMB_CLICK_REMOVER **)((long)cr + uVar2 * 2),
                         *(sample_t_conflict **)((long)samples + uVar2),length,2,halflife);
      dumb_remove_clicks(*(DUMB_CLICK_REMOVER **)((long)cr + uVar2 * 2 + 8),
                         (sample_t_conflict *)(*(long *)((long)samples + uVar2) + 4),length,2,
                         halflife);
    }
    if ((n & 1U) != 0) {
      dumb_remove_clicks(cr[(uint)((int)uVar1 * 2)],samples[uVar1],length,1,halflife);
      return;
    }
  }
  return;
}

Assistant:

void DUMBEXPORT dumb_remove_clicks_array(int n, DUMB_CLICK_REMOVER **cr, sample_t **samples, int32 length, double halflife)
{
	if (cr) {
		int i;
		for (i = 0; i < n >> 1; i++) {
			dumb_remove_clicks(cr[i << 1], samples[i], length, 2, halflife);
			dumb_remove_clicks(cr[(i << 1) + 1], samples[i] + 1, length, 2, halflife);
		}
		if (n & 1)
			dumb_remove_clicks(cr[i << 1], samples[i], length, 1, halflife);
	}
}